

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

LitVec * __thiscall Clasp::mt::ParallelSolve::SharedData::requestWork(SharedData *this,Solver *s)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  uint32 uVar5;
  ulong __i;
  __int_type_conflict2 _Var6;
  Solver *in_RSI;
  char *in_RDI;
  unique_lock<std::mutex> lock;
  LitVec *ret;
  uint64 m;
  undefined4 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  SharedData *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  Solver *in_stack_ffffffffffffff58;
  Solver *in_stack_ffffffffffffff60;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff74;
  SharedData *local_70;
  SharedData *local_30;
  
  uVar5 = Solver::id(in_RSI);
  __i = 1L << ((byte)uVar5 & 0x3f);
  _Var6 = std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base<unsigned_long> *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,
                                       CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                                      )));
  if ((_Var6 & __i) == __i) {
    bVar2 = allowSplit((SharedData *)0x221143);
    if (!bVar2) {
      std::__atomic_base<unsigned_long>::operator-=
                ((__atomic_base<unsigned_long> *)(in_RDI + 0x70),__i);
      return *(LitVec **)(in_RDI + 0x68);
    }
    in_stack_ffffffffffffff58 = (Solver *)(in_RDI + 0x70);
    in_stack_ffffffffffffff60 = (Solver *)0x4;
    LOCK();
    lVar1 = *(long *)in_stack_ffffffffffffff58;
    *(long *)in_stack_ffffffffffffff58 = 0;
    UNLOCK();
    if (lVar1 != 0) {
      return *(LitVec **)(in_RDI + 0x68);
    }
  }
  bVar2 = allowSplit((SharedData *)0x22128f);
  if (bVar2) {
    MessageEvent::MessageEvent
              ((MessageEvent *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               *(char **)(in_RDI + 0x60),
               CONCAT13(in_stack_ffffffffffffff4f,
                        CONCAT12(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c)),
               (double)in_stack_ffffffffffffff40);
    SharedContext::report
              ((SharedContext *)in_stack_ffffffffffffff40,
               (Event *)CONCAT17(in_stack_ffffffffffffff3f,
                                 CONCAT16(in_stack_ffffffffffffff3e,
                                          CONCAT24(in_stack_ffffffffffffff3c,
                                                   in_stack_ffffffffffffff38))));
    local_70 = (SharedData *)0x0;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff40,
               (mutex_type *)
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,
                                 CONCAT24(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))));
    while (uVar3 = hasControl(in_stack_ffffffffffffff40,
                              CONCAT13(in_stack_ffffffffffffff3f,
                                       CONCAT12(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff3c)
                                      )), ((uVar3 ^ 0xff) & 1) != 0) {
      uVar4 = PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
              ::empty((PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                       *)in_stack_ffffffffffffff40);
      if (!(bool)uVar4) {
        local_70 = (SharedData *)
                   PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                   ::pop_ret((PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                              *)0x221379);
        in_stack_ffffffffffffff40 = local_70;
        bVar2 = PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                ::empty((PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                         *)local_70);
        if (bVar2) {
          PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>::
          clear((PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>
                 *)in_stack_ffffffffffffff40);
        }
        break;
      }
      postMessage((SharedData *)
                  CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff4c,
                                                         in_stack_ffffffffffffff48))),
                  (Message)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                  SUB81((ulong)in_stack_ffffffffffffff40 >> 0x18,0));
      in_stack_ffffffffffffff3e =
           enterWait((SharedData *)
                     CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_ffffffffffffff4c,
                                                            in_stack_ffffffffffffff48))),
                     (unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      if (!(bool)in_stack_ffffffffffffff3e) break;
    }
    uVar7 = 2;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40)
    ;
    SharedContext::report
              ((SharedContext *)CONCAT44(in_stack_ffffffffffffff74,uVar7),in_RDI,
               in_stack_ffffffffffffff60);
    local_30 = local_70;
  }
  else {
    local_30 = (SharedData *)0x0;
  }
  return (LitVec *)local_30;
}

Assistant:

const LitVec* requestWork(const Solver& s) {
		const uint64 m(uint64(1) << s.id());
		if ((initVec & m) == m) {
			if (!allowSplit()) {
				// portfolio mode - all solvers can start with initial path
				initVec -= m;
				return path;
			}
			if (initVec.exchange(0) != 0) {
				// splitting mode - only one solver must start with initial path
				return path;
			}
		}
		if (!allowSplit()) { return 0; }
		ctx->report(MessageEvent(s, "SPLIT", MessageEvent::sent));
		// try to get work from split
		const LitVec* ret = 0;
		for (unique_lock<mutex> lock(workM); !hasControl(uint32(terminate_flag|sync_flag));) {
			if (!workQ.empty()) {
				ret = workQ.pop_ret();
				if (workQ.empty()) { workQ.clear(); }
				break;
			}
			postMessage(msg_split, false);
			if (!enterWait(lock))
				break;
		}
		ctx->report("resume after wait", &s);
		return ret;
	}